

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_parse.cpp
# Opt level: O0

void __thiscall FParser::EvaluateExpression(FParser *this,svalue_t *result,int start,int stop)

{
  FString *this_00;
  char *pcVar1;
  long *plVar2;
  code *local_60;
  FString local_30;
  FString tempstr;
  int n;
  int i;
  int stop_local;
  int start_local;
  svalue_t *result_local;
  FParser *this_local;
  
  n = stop;
  i = start;
  _stop_local = result;
  result_local = (svalue_t *)this;
  if ((this->TokenType[start] == operator_) && (this->TokenType[stop] == operator_)) {
    PointlessBrackets(this,&i,&n);
  }
  if (i == n) {
    SimpleEvaluate(this,_stop_local,i);
  }
  else {
    for (tempstr.Chars._4_4_ = 0; tempstr.Chars._4_4_ < num_operators;
        tempstr.Chars._4_4_ = tempstr.Chars._4_4_ + 1) {
      if (operators[tempstr.Chars._4_4_].direction == 0) {
        tempstr.Chars._0_4_ = FindOperatorBackwards(this,i,n,operators[tempstr.Chars._4_4_].string);
      }
      else {
        tempstr.Chars._0_4_ = FindOperator(this,i,n,operators[tempstr.Chars._4_4_].string);
      }
      if ((int)tempstr.Chars != -1) {
        local_60 = (code *)operators[tempstr.Chars._4_4_].handler;
        plVar2 = (long *)((long)this->Tokens +
                         *(long *)&operators[tempstr.Chars._4_4_].field_0x10 + -0x10);
        if (((ulong)local_60 & 1) != 0) {
          local_60 = *(code **)(local_60 + *plVar2 + -1);
        }
        (*local_60)(plVar2,_stop_local,i,(int)tempstr.Chars,n);
        return;
      }
    }
    if (this->TokenType[i] == function) {
      EvaluateFunction(this,_stop_local,i,n);
    }
    else {
      FString::FString(&local_30);
      for (tempstr.Chars._4_4_ = i; tempstr.Chars._4_4_ <= n;
          tempstr.Chars._4_4_ = tempstr.Chars._4_4_ + 1) {
        this_00 = FString::operator<<(&local_30,this->Tokens[tempstr.Chars._4_4_]);
        FString::operator<<(this_00,' ');
      }
      pcVar1 = FString::GetChars(&local_30);
      script_error("couldnt evaluate expression: %s\n",pcVar1);
      FString::~FString(&local_30);
    }
  }
  return;
}

Assistant:

void FParser::EvaluateExpression(svalue_t &result, int start, int stop)
{
	int i, n;
	
	// possible pointless brackets
	if(TokenType[start] == operator_ && TokenType[stop] == operator_)
		PointlessBrackets(&start, &stop);

	if(start == stop)       // only 1 thing to evaluate
    {
		SimpleEvaluate(result, start);
		return;
    }
	
	// go through each operator in order of precedence
	for(i=0; i<num_operators; i++)
    {
		// check backwards for the token. it has to be
		// done backwards for left-to-right reading: eg so
		// 5-3-2 is (5-3)-2 not 5-(3-2)
		
		if (operators[i].direction==forward)
		{
			n = FindOperatorBackwards(start, stop, operators[i].string);
		}
		else
		{
			n = FindOperator(start, stop, operators[i].string);
		}

		if( n != -1)
		{
			// call the operator function and evaluate this chunk of tokens
			(this->*operators[i].handler)(result, start, n, stop);
			return;
		}
    }
	
	if(TokenType[start] == function)
	{
		EvaluateFunction(result, start, stop);
		return;
	}
	
	// error ?
	{        
		FString tempstr;
		
		for(i=start; i<=stop; i++) tempstr << Tokens[i] << ' ';
		script_error("couldnt evaluate expression: %s\n",tempstr.GetChars());
	}
}